

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_acquire_write(ma_rb *pRB,size_t *pSizeInBytes,void **ppBufferOut)

{
  uint uVar1;
  ulong local_a0;
  size_t bytesRequested;
  size_t bytesAvailable;
  ma_uint32 writeOffsetLoopFlag;
  ma_uint32 writeOffsetInBytes;
  ma_uint32 writeOffset;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  void **ppBufferOut_local;
  size_t *pSizeInBytes_local;
  ma_rb *pRB_local;
  size_t *local_58;
  long local_50;
  uint local_44;
  ma_uint32 *local_40;
  ma_uint32 *local_38;
  uint local_30;
  uint local_2c;
  ma_rb *local_28;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  if (((pRB == (ma_rb *)0x0) || (pSizeInBytes == (size_t *)0x0)) || (ppBufferOut == (void **)0x0)) {
    pRB_local._4_4_ = -2;
  }
  else {
    readOffsetLoopFlag = pRB->encodedReadOffset;
    local_38 = &writeOffset;
    local_40 = &writeOffsetInBytes;
    _readOffsetInBytes = ppBufferOut;
    ppBufferOut_local = (void **)pSizeInBytes;
    pSizeInBytes_local = (size_t *)pRB;
    local_30 = readOffsetLoopFlag;
    if (local_38 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetInBytes != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if (local_40 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetLoopFlag != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    writeOffsetLoopFlag = pRB->encodedWriteOffset;
    local_50 = (long)&bytesAvailable + 4;
    local_58 = &bytesAvailable;
    local_44 = writeOffsetLoopFlag;
    local_18 = readOffsetLoopFlag;
    local_10 = readOffsetLoopFlag;
    if (local_50 == 0) {
      __assert_fail("pOffsetInBytes != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if (local_58 == (size_t *)0x0) {
      __assert_fail("pOffsetLoopFlag != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if ((writeOffsetLoopFlag & 0x80000000) == (readOffsetLoopFlag & 0x80000000)) {
      uVar1 = pRB->subbufferSizeInBytes - (writeOffsetLoopFlag & 0x7fffffff);
    }
    else {
      uVar1 = (readOffsetLoopFlag & 0x7fffffff) - (writeOffsetLoopFlag & 0x7fffffff);
    }
    bytesRequested = (size_t)uVar1;
    local_a0 = *pSizeInBytes;
    if (bytesRequested < local_a0) {
      local_a0 = bytesRequested;
    }
    *pSizeInBytes = local_a0;
    local_28 = pRB;
    local_14 = writeOffsetLoopFlag;
    local_c = writeOffsetLoopFlag;
    if (pRB == (ma_rb *)0x0) {
      __assert_fail("pRB != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa510,"void *ma_rb__get_write_ptr(ma_rb *)");
    }
    local_2c = pRB->encodedWriteOffset;
    *ppBufferOut = (void *)((long)pRB->pBuffer + (ulong)(local_2c & 0x7fffffff));
    if (pRB->clearOnWriteAcquire != '\0') {
      local_1c = local_2c;
      memset(*ppBufferOut,0,*pSizeInBytes);
    }
    pRB_local._4_4_ = 0;
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_result ma_rb_acquire_write(ma_rb* pRB, size_t* pSizeInBytes, void** ppBufferOut)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    size_t bytesAvailable;
    size_t bytesRequested;

    if (pRB == NULL || pSizeInBytes == NULL || ppBufferOut == NULL) {
        return MA_INVALID_ARGS;
    }

    /* The returned buffer should never overtake the read buffer. */
    readOffset = c89atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = c89atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    /*
    In the case of writing, if the write pointer and the read pointer are on the same loop iteration we can only
    write up to the end of the buffer. Otherwise we can only write up to the read pointer. The write pointer should
    never overtake the read pointer.
    */
    if (writeOffsetLoopFlag == readOffsetLoopFlag) {
        bytesAvailable = pRB->subbufferSizeInBytes - writeOffsetInBytes;
    } else {
        bytesAvailable = readOffsetInBytes - writeOffsetInBytes;
    }

    bytesRequested = *pSizeInBytes;
    if (bytesRequested > bytesAvailable) {
        bytesRequested = bytesAvailable;
    }

    *pSizeInBytes = bytesRequested;
    *ppBufferOut  = ma_rb__get_write_ptr(pRB);

    /* Clear the buffer if desired. */
    if (pRB->clearOnWriteAcquire) {
        MA_ZERO_MEMORY(*ppBufferOut, *pSizeInBytes);
    }

    return MA_SUCCESS;
}